

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_write_SAM_hdr(cram_fd *fd,SAM_hdr *hdr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  cram_file_def *def;
  hFILE *fp;
  ref_entry **pprVar4;
  ref_entry *prVar5;
  int64_t iVar6;
  uint uVar7;
  int iVar8;
  SAM_RG *pSVar9;
  char *pcVar10;
  size_t sVar11;
  SAM_hdr_type *type;
  SAM_hdr_tag *pSVar12;
  long lVar13;
  char *pcVar14;
  cram_block *b;
  cram_container *c;
  uchar *puVar15;
  int32_t *piVar16;
  void *__src;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  SAM_hdr *extraout_RDX;
  SAM_hdr *extraout_RDX_00;
  SAM_hdr *h;
  int32_t iVar21;
  size_t sVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  size_t sVar26;
  size_t sVar27;
  int i;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  int local_1090;
  uchar buf [16];
  uchar buf2 [33];
  MD5_CTX md5;
  
  uVar7 = fd->version;
  iVar24 = (int)uVar7 >> 8;
  def = fd->file_def;
  if (def->major_version == '\0') {
    def->major_version = (uint8_t)(uVar7 >> 8);
    def->minor_version = (uint8_t)uVar7;
    iVar8 = cram_write_file_def(fd,def);
    if (iVar8 != 0) {
      return -1;
    }
    uVar7 = fd->version;
  }
  if ((((uVar7 & 0xffffff00) == 0x100) &&
      (pSVar9 = sam_hdr_find_rg(hdr,"UNKNOWN"), pSVar9 == (SAM_RG *)0x0)) &&
     (iVar8 = sam_hdr_add(hdr,"RG","ID","UNKNOWN","SM","UNKNOWN",0), iVar8 != 0)) {
    return -1;
  }
  if ((fd->refs != (refs_t *)0x0) && (fd->no_ref == 0)) {
    for (lVar28 = 0; lVar28 < hdr->nref; lVar28 = lVar28 + 1) {
      type = sam_hdr_find(hdr,"SQ","SN",hdr->ref[lVar28].name);
      if (type == (SAM_hdr_type *)0x0) {
        return -1;
      }
      pSVar12 = sam_hdr_find_key(hdr,type,"M5",(SAM_hdr_tag **)0x0);
      if (pSVar12 == (SAM_hdr_tag *)0x0) {
        if (fd->refs == (refs_t *)0x0) {
          return -1;
        }
        pprVar4 = fd->refs->ref_id;
        if (pprVar4 == (ref_entry **)0x0) {
          return -1;
        }
        prVar5 = pprVar4[lVar28];
        if (prVar5 == (ref_entry *)0x0) {
          return -1;
        }
        iVar6 = prVar5->length;
        MD5_Init((MD5_CTX *)&md5);
        pcVar10 = cram_get_ref(fd,(int)lVar28,1,(int)iVar6);
        if (pcVar10 == (char *)0x0) {
          return -1;
        }
        MD5_Update((MD5_CTX *)&md5,pcVar10,(long)(int)fd->refs->ref_id[lVar28]->length);
        MD5_Final(buf,(MD5_CTX *)&md5);
        cram_ref_decr(fd->refs,(int)lVar28);
        for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
          bVar1 = buf[lVar13];
          buf2[lVar13 * 2] = "0123456789abcdef"[bVar1 >> 4];
          buf2[lVar13 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
        }
        buf2[0x20] = '\0';
        iVar8 = sam_hdr_update(hdr,type,"M5",buf2,0);
        if (iVar8 != 0) {
          return -1;
        }
      }
      pcVar10 = fd->ref_fn;
      if (pcVar10 != (char *)0x0) {
        if (*pcVar10 == '/') {
          strncpy((char *)&md5,pcVar10,0x1000);
        }
        else {
          pcVar14 = getcwd((char *)&md5,0x1000);
          if (pcVar14 != (char *)0x0) {
            sVar26 = strlen((char *)&md5);
            sVar27 = strlen(pcVar10);
            if (sVar27 + ((long)((sVar26 << 0x20) + 0x100000000) >> 0x20) < 0x1000) {
              local_1090 = (int)sVar26;
              sprintf((char *)(md5.buffer + ((long)(sVar26 << 0x20) >> 0x20) + -0x18),"/%.*s",
                      (ulong)(0x1000 - local_1090),pcVar10);
              goto LAB_0011fbd9;
            }
          }
          strncpy((char *)&md5,pcVar10,0x1000);
        }
LAB_0011fbd9:
        iVar8 = sam_hdr_update(hdr,type,"UR",&md5,0);
        if (iVar8 != 0) {
          return -1;
        }
      }
    }
  }
  iVar8 = sam_hdr_rebuild(hdr);
  if (iVar8 != 0) {
    return -1;
  }
  iVar8 = sam_hdr_length(hdr);
  sVar22 = (size_t)iVar8;
  if ((fd->version & 0xffffff00U) == 0x100) {
    iVar24 = int32_encode(fd,iVar8);
    if (iVar24 == -1) {
      return -1;
    }
    fp = fd->fp;
    pcVar10 = sam_hdr_str(hdr);
    sVar11 = hwrite(fp,pcVar10,sVar22);
    h = extraout_RDX;
    if (sVar11 != sVar22) {
      return -1;
    }
LAB_00120257:
    iVar24 = -1;
    iVar8 = refs_from_header(fd->refs,(cram_fd *)fd->header,h);
    if ((iVar8 != -1) && (iVar8 = refs2id(fd->refs,fd->header), iVar8 != -1)) {
      iVar24 = hflush(fd->fp);
      iVar24 = -(uint)(iVar24 != 0);
    }
  }
  else {
    b = cram_new_block(FILE_HEADER,0);
    c = cram_new_container(0,0);
    if (b == (cram_block *)0x0 || c == (cram_container *)0x0) {
      if (b != (cram_block *)0x0) {
        cram_free_block(b);
      }
      if (c == (cram_container *)0x0) {
        return -1;
      }
    }
    else {
      iVar2 = fd->version;
      int32_put(b,iVar8);
      while( true ) {
        uVar23 = b->alloc;
        sVar11 = b->byte;
        if (sVar22 + sVar11 < uVar23) break;
        auVar29._8_4_ = (int)(uVar23 >> 0x20);
        auVar29._0_8_ = uVar23;
        auVar29._12_4_ = 0x45300000;
        dVar32 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0)) * 1.5;
        uVar18 = (ulong)dVar32;
        sVar26 = (long)(dVar32 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18;
        if (uVar23 == 0) {
          sVar26 = 0x400;
        }
        b->alloc = sVar26;
        puVar15 = (uchar *)realloc(b->data,sVar26);
        b->data = puVar15;
      }
      puVar15 = b->data;
      pcVar10 = sam_hdr_str(hdr);
      memcpy(puVar15 + sVar11,pcVar10,sVar22);
      sVar22 = sVar22 + b->byte;
      b->byte = sVar22;
      iVar21 = (int32_t)sVar22;
      b->uncomp_size = iVar21;
      b->comp_size = iVar21;
      if ((0x2ff < fd->version) && (0 < fd->level)) {
        cram_compress_block(fd,b,(cram_metrics *)0x0,
                            (uint)(fd->use_bz2 != 0) * 4 + (uint)(fd->use_lzma != 0) * 8 + 2,
                            fd->level);
      }
      if (iVar24 < 3) {
        c->num_blocks = 1;
        c->num_landmarks = 1;
        piVar16 = (int32_t *)malloc(4);
        c->landmark = piVar16;
        if (piVar16 == (int32_t *)0x0) {
          return -1;
        }
        *piVar16 = 0;
        dVar32 = (double)c->length * 1.5;
        if (dVar32 <= 10000.0) {
          dVar32 = 10000.0;
        }
        uVar7 = b->content_id;
        iVar20 = 1;
        iVar8 = iVar20;
        if (0x7f < uVar7) {
          if (uVar7 < 0x4000) {
            iVar8 = 2;
          }
          else if (uVar7 < 0x200000) {
            iVar8 = 3;
          }
          else {
            iVar8 = 5 - (uint)(uVar7 < 0x10000000);
          }
        }
        uVar7 = b->comp_size;
        uVar25 = b->uncomp_size;
        iVar17 = iVar20;
        if (0x7f < uVar25) {
          if (uVar25 < 0x4000) {
            iVar17 = 2;
          }
          else if (uVar25 < 0x200000) {
            iVar17 = 3;
          }
          else {
            iVar17 = 5 - (uint)(uVar25 < 0x10000000);
          }
        }
        uVar25 = (uint)(dVar32 - (double)c->length);
        if (0x7f < uVar7) {
          if (uVar7 < 0x4000) {
            iVar20 = 2;
          }
          else if (uVar7 < 0x200000) {
            iVar20 = 3;
          }
          else {
            iVar20 = 5 - (uint)(uVar7 < 0x10000000);
          }
        }
        c->length = iVar20 + uVar7 + (uint)(0x2ff < iVar2) * 4 + iVar8 + iVar17 + uVar25 + 2;
        sVar26 = (size_t)(int)uVar25;
        __src = calloc(1,sVar26);
        if (__src == (void *)0x0) {
          cram_free_block(b);
          goto LAB_001201f9;
        }
        while( true ) {
          uVar23 = b->alloc;
          if (b->byte + sVar26 < uVar23) break;
          auVar30._8_4_ = (int)(uVar23 >> 0x20);
          auVar30._0_8_ = uVar23;
          auVar30._12_4_ = 0x45300000;
          dVar32 = ((auVar30._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0)) * 1.5;
          uVar18 = (ulong)dVar32;
          sVar27 = (long)(dVar32 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18;
          if (uVar23 == 0) {
            sVar27 = 0x400;
          }
          b->alloc = sVar27;
          puVar15 = (uchar *)realloc(b->data,sVar27);
          b->data = puVar15;
        }
        memcpy(b->data + b->byte,__src,sVar26);
        sVar22 = sVar26 + b->byte;
        b->byte = sVar22;
        iVar21 = (int32_t)sVar22;
        b->uncomp_size = iVar21;
        b->comp_size = iVar21;
        free(__src);
      }
      else {
        uVar7 = b->content_id;
        iVar20 = 1;
        iVar8 = iVar20;
        if (0x7f < uVar7) {
          if (uVar7 < 0x4000) {
            iVar8 = 2;
          }
          else if (uVar7 < 0x200000) {
            iVar8 = 3;
          }
          else {
            iVar8 = 5 - (uint)(uVar7 < 0x10000000);
          }
        }
        uVar25 = b->comp_size;
        uVar3 = b->uncomp_size;
        iVar17 = iVar20;
        if (0x7f < uVar3) {
          if (uVar3 < 0x4000) {
            iVar17 = 2;
          }
          else if (uVar3 < 0x200000) {
            iVar17 = 3;
          }
          else {
            iVar17 = 5 - (uint)(uVar3 < 0x10000000);
          }
        }
        if (0x7f < uVar25) {
          if (uVar25 < 0x4000) {
            iVar20 = 2;
          }
          else if (uVar25 < 0x200000) {
            iVar20 = 3;
          }
          else {
            iVar20 = 5 - (uint)(uVar25 < 0x10000000);
          }
        }
        iVar8 = iVar8 + iVar17 + iVar20 + uVar25 + (uint)(0x2ff < iVar2) * 4 + 2;
        c->length = iVar8;
        c->num_blocks = 2;
        c->num_landmarks = 2;
        piVar16 = (int32_t *)malloc(8);
        c->landmark = piVar16;
        if (piVar16 == (int32_t *)0x0) {
          cram_free_block(b);
LAB_001201f9:
          cram_free_container(c);
          return -1;
        }
        *piVar16 = 0;
        dVar32 = (double)iVar8 * 0.5;
        if (10000.0 <= dVar32) {
          dVar32 = 10000.0;
        }
        piVar16[1] = iVar8;
        uVar25 = (uint)dVar32;
        if (uVar7 < 0x80) {
          iVar20 = 1;
        }
        else if (uVar7 < 0x4000) {
          iVar20 = 2;
        }
        else if (uVar7 < 0x200000) {
          iVar20 = 3;
        }
        else {
          iVar20 = 5 - (uint)(uVar7 < 0x10000000);
        }
        if (uVar25 < 0x80) {
          iVar17 = 2;
        }
        else if (uVar25 < 0x4000) {
          iVar17 = 4;
        }
        else if (uVar25 < 0x200000) {
          iVar17 = 6;
        }
        else {
          iVar17 = (uint)(0xfffffff < uVar25) * 2 + 8;
        }
        c->length = (uint)(0x2ff < iVar2) * 4 + 2 + iVar8 + iVar20 + iVar17 + uVar25;
      }
      iVar8 = cram_write_container(fd,c);
      if ((iVar8 != -1) && (iVar8 = cram_write_block(fd,b), iVar8 != -1)) {
        if (2 < iVar24) {
          uVar23 = (ulong)(int)uVar25;
          while (uVar18 = b->alloc, uVar18 <= uVar23) {
            auVar31._8_4_ = (int)(uVar18 >> 0x20);
            auVar31._0_8_ = uVar18;
            auVar31._12_4_ = 0x45300000;
            dVar32 = ((auVar31._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) * 1.5;
            uVar19 = (ulong)dVar32;
            sVar26 = (long)(dVar32 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19;
            if (uVar18 == 0) {
              sVar26 = 0x400;
            }
            b->alloc = sVar26;
            puVar15 = (uchar *)realloc(b->data,sVar26);
            b->data = puVar15;
          }
          memset(b->data,0,uVar23);
          b->byte = uVar23;
          b->uncomp_size = uVar25;
          b->comp_size = uVar25;
          b->method = RAW;
          iVar24 = cram_write_block(fd,b);
          if (iVar24 == -1) goto LAB_0012028d;
        }
        cram_free_block(b);
        cram_free_container(c);
        h = extraout_RDX_00;
        goto LAB_00120257;
      }
LAB_0012028d:
      cram_free_block(b);
    }
    iVar24 = -1;
    cram_free_container(c);
  }
  return iVar24;
}

Assistant:

int cram_write_SAM_hdr(cram_fd *fd, SAM_hdr *hdr) {
    int header_len;
    int blank_block = (CRAM_MAJOR_VERS(fd->version) >= 3);

    /* Write CRAM MAGIC if not yet written. */
    if (fd->file_def->major_version == 0) {
	fd->file_def->major_version = CRAM_MAJOR_VERS(fd->version);
	fd->file_def->minor_version = CRAM_MINOR_VERS(fd->version);
	if (0 != cram_write_file_def(fd, fd->file_def))
	    return -1;
    }

    /* 1.0 requires and UNKNOWN read-group */
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	if (!sam_hdr_find_rg(hdr, "UNKNOWN"))
	    if (sam_hdr_add(hdr, "RG",
			    "ID", "UNKNOWN", "SM", "UNKNOWN", NULL))
		return -1;
    }

    /* Fix M5 strings */
    if (fd->refs && !fd->no_ref) {
	int i;
	for (i = 0; i < hdr->nref; i++) {
	    SAM_hdr_type *ty;
	    char *ref;

	    if (!(ty = sam_hdr_find(hdr, "SQ", "SN", hdr->ref[i].name)))
		return -1;

	    if (!sam_hdr_find_key(hdr, ty, "M5", NULL)) {
		char unsigned buf[16], buf2[33];
		int j, rlen;
		MD5_CTX md5;

		if (!fd->refs ||
		    !fd->refs->ref_id ||
		    !fd->refs->ref_id[i]) {
		    return -1;
		}
		rlen = fd->refs->ref_id[i]->length;
		MD5_Init(&md5);
		ref = cram_get_ref(fd, i, 1, rlen);
		if (NULL == ref) return -1;
		rlen = fd->refs->ref_id[i]->length; /* In case it just loaded */
		MD5_Update(&md5, ref, rlen);
		MD5_Final(buf, &md5);
		cram_ref_decr(fd->refs, i);

		for (j = 0; j < 16; j++) {
		    buf2[j*2+0] = "0123456789abcdef"[buf[j]>>4];
		    buf2[j*2+1] = "0123456789abcdef"[buf[j]&15];
		}
		buf2[32] = 0;
		if (sam_hdr_update(hdr, ty, "M5", buf2, NULL))
		    return -1;
	    }

	    if (fd->ref_fn) {
		char ref_fn[PATH_MAX];
		full_path(ref_fn, fd->ref_fn);
		if (sam_hdr_update(hdr, ty, "UR", ref_fn, NULL))
		    return -1;
	    }
	}
    }

    if (sam_hdr_rebuild(hdr))
	return -1;

    /* Length */
    header_len = sam_hdr_length(hdr);
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	if (-1 == int32_encode(fd, header_len))
	    return -1;

	/* Text data */
	if (header_len != hwrite(fd->fp, sam_hdr_str(hdr), header_len))
	    return -1;
    } else {
	/* Create block(s) inside a container */
	cram_block *b = cram_new_block(FILE_HEADER, 0);
	cram_container *c = cram_new_container(0, 0);
	int padded_length;
	char *pads;
	int is_cram_3 = (CRAM_MAJOR_VERS(fd->version) >= 3);

	if (!b || !c) {
	    if (b) cram_free_block(b);
	    if (c) cram_free_container(c);
	    return -1;
	}

	int32_put(b, header_len);
	BLOCK_APPEND(b, sam_hdr_str(hdr), header_len);
	BLOCK_UPLEN(b);

	// Compress header block if V3.0 and above
	if (CRAM_MAJOR_VERS(fd->version) >= 3 && fd->level > 0) {
	    int method = 1<<GZIP;
	    if (fd->use_bz2)
		method |= 1<<BZIP2;
	    if (fd->use_lzma)
		method |= 1<<LZMA;
	    cram_compress_block(fd, b, NULL, method, fd->level);
	} 

	if (blank_block) {
	    c->length = b->comp_size + 2 + 4*is_cram_3 +
		itf8_size(b->content_id)   + 
		itf8_size(b->uncomp_size)  +
		itf8_size(b->comp_size);

	    c->num_blocks = 2;
	    c->num_landmarks = 2;
	    if (!(c->landmark = malloc(2*sizeof(*c->landmark)))) {
		cram_free_block(b);
		cram_free_container(c);
		return -1;
	    }
	    c->landmark[0] = 0;
	    c->landmark[1] = c->length;

	    // Plus extra storage for uncompressed secondary blank block
	    padded_length = MIN(c->length*.5, 10000);
	    c->length += padded_length + 2 + 4*is_cram_3 +
		itf8_size(b->content_id) + 
		itf8_size(padded_length)*2;
	} else {
	    // Pad the block instead.
	    c->num_blocks = 1;
	    c->num_landmarks = 1;
	    if (!(c->landmark = malloc(sizeof(*c->landmark))))
		return -1;
	    c->landmark[0] = 0;

	    padded_length = MAX(c->length*1.5, 10000) - c->length;

	    c->length = b->comp_size + padded_length +
		2 + 4*is_cram_3 +
		itf8_size(b->content_id)   + 
		itf8_size(b->uncomp_size)  +
		itf8_size(b->comp_size);

	    if (NULL == (pads = calloc(1, padded_length))) {
		cram_free_block(b);
		cram_free_container(c);
		return -1;
	    }
	    BLOCK_APPEND(b, pads, padded_length);
	    BLOCK_UPLEN(b);
	    free(pads);
	}

	if (-1 == cram_write_container(fd, c)) {
	    cram_free_block(b);
	    cram_free_container(c);
	    return -1;
	}

	if (-1 == cram_write_block(fd, b)) {
	    cram_free_block(b);
	    cram_free_container(c);
	    return -1;
	}

	if (blank_block) {
	    BLOCK_RESIZE(b, padded_length);
	    memset(BLOCK_DATA(b), 0, padded_length);
	    BLOCK_SIZE(b) = padded_length;
	    BLOCK_UPLEN(b);
	    b->method = RAW;
	    if (-1 == cram_write_block(fd, b)) {
		cram_free_block(b);
		cram_free_container(c);
		return -1;
	    }
	}

	cram_free_block(b);
	cram_free_container(c);
    }

    if (-1 == refs_from_header(fd->refs, fd, fd->header))
	return -1;
    if (-1 == refs2id(fd->refs, fd->header))
	return -1;

    if (0 != hflush(fd->fp))
	return -1;

    RP("=== Finishing saving header ===\n");

    return 0;
}